

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001d3370 = 0x2d2d2d2d2d2d2d;
    uRam00000000001d3377._0_1_ = '-';
    uRam00000000001d3377._1_1_ = '-';
    uRam00000000001d3377._2_1_ = '-';
    uRam00000000001d3377._3_1_ = '-';
    uRam00000000001d3377._4_1_ = '-';
    uRam00000000001d3377._5_1_ = '-';
    uRam00000000001d3377._6_1_ = '-';
    uRam00000000001d3377._7_1_ = '-';
    DAT_001d3360 = '-';
    DAT_001d3360_1._0_1_ = '-';
    DAT_001d3360_1._1_1_ = '-';
    DAT_001d3360_1._2_1_ = '-';
    DAT_001d3360_1._3_1_ = '-';
    DAT_001d3360_1._4_1_ = '-';
    DAT_001d3360_1._5_1_ = '-';
    DAT_001d3360_1._6_1_ = '-';
    uRam00000000001d3368 = 0x2d2d2d2d2d2d2d;
    DAT_001d336f = 0x2d;
    DAT_001d3350 = '-';
    DAT_001d3350_1._0_1_ = '-';
    DAT_001d3350_1._1_1_ = '-';
    DAT_001d3350_1._2_1_ = '-';
    DAT_001d3350_1._3_1_ = '-';
    DAT_001d3350_1._4_1_ = '-';
    DAT_001d3350_1._5_1_ = '-';
    DAT_001d3350_1._6_1_ = '-';
    uRam00000000001d3358._0_1_ = '-';
    uRam00000000001d3358._1_1_ = '-';
    uRam00000000001d3358._2_1_ = '-';
    uRam00000000001d3358._3_1_ = '-';
    uRam00000000001d3358._4_1_ = '-';
    uRam00000000001d3358._5_1_ = '-';
    uRam00000000001d3358._6_1_ = '-';
    uRam00000000001d3358._7_1_ = '-';
    DAT_001d3340 = '-';
    DAT_001d3340_1._0_1_ = '-';
    DAT_001d3340_1._1_1_ = '-';
    DAT_001d3340_1._2_1_ = '-';
    DAT_001d3340_1._3_1_ = '-';
    DAT_001d3340_1._4_1_ = '-';
    DAT_001d3340_1._5_1_ = '-';
    DAT_001d3340_1._6_1_ = '-';
    uRam00000000001d3348._0_1_ = '-';
    uRam00000000001d3348._1_1_ = '-';
    uRam00000000001d3348._2_1_ = '-';
    uRam00000000001d3348._3_1_ = '-';
    uRam00000000001d3348._4_1_ = '-';
    uRam00000000001d3348._5_1_ = '-';
    uRam00000000001d3348._6_1_ = '-';
    uRam00000000001d3348._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001d3338._0_1_ = '-';
    uRam00000000001d3338._1_1_ = '-';
    uRam00000000001d3338._2_1_ = '-';
    uRam00000000001d3338._3_1_ = '-';
    uRam00000000001d3338._4_1_ = '-';
    uRam00000000001d3338._5_1_ = '-';
    uRam00000000001d3338._6_1_ = '-';
    uRam00000000001d3338._7_1_ = '-';
    DAT_001d337f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}